

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool checkInterfaceDirs(string *prepro,cmGeneratorTarget *target,string *prop)

{
  cmMakefile *this;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  char *b;
  cmLocalGenerator *pcVar7;
  char *__s1;
  char *__s2;
  size_type sVar8;
  string *psVar9;
  ostream *poVar10;
  size_t sVar11;
  PolicyID id;
  PolicyID id_00;
  pointer input;
  char *pcVar12;
  MessageType t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  ostringstream s;
  ostringstream e;
  string local_368;
  int local_344;
  PolicyMap *local_340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this = target->Makefile;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
  b = cmMakefile::GetSafeDefinition(this,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
  __s1 = cmLocalGenerator::GetSourceDirectory(pcVar7);
  pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
  __s2 = cmLocalGenerator::GetBinaryDirectory(pcVar7);
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorExpression::Split(prepro,&local_338);
  local_344 = strcmp(__s1,__s2);
  if (local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_338.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    local_340 = &target->PolicyMap;
    bVar1 = 0;
    input = local_338.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar8 = cmGeneratorExpression::Find(input);
      if (sVar8 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        t = FATAL_ERROR;
        if (sVar8 == 0xffffffffffffffff) {
LAB_002fe610:
          pcVar12 = (input->_M_dataplus)._M_p;
          iVar5 = strncmp(pcVar12,"${_IMPORT_PREFIX}",0x11);
          if (iVar5 != 0) {
            bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar12);
            if (!bVar2) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                                   psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(prop->_M_dataplus)._M_p,prop->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," property contains relative path:\n  \"",0x25);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(input->_M_dataplus)._M_p,input->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
              pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar7,t,(string *)local_320);
              if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
              }
            }
            bVar2 = isSubDirectory((input->_M_dataplus)._M_p,__s2);
            bVar3 = isSubDirectory((input->_M_dataplus)._M_p,__s1);
            bVar4 = isSubDirectory((input->_M_dataplus)._M_p,b);
            if (bVar4) {
              if (bVar2) {
                bVar4 = isSubDirectory(b,__s2);
                if (bVar3 && bVar4) goto LAB_002fe788;
              }
              else {
                if (!bVar3) {
                  std::__cxx11::string::compare((char *)prop);
                  goto LAB_002fecb1;
                }
LAB_002fe788:
                bVar4 = isSubDirectory(b,__s1);
              }
              iVar5 = std::__cxx11::string::compare((char *)prop);
              if ((bVar4 == false) && (iVar5 == 0)) {
                PVar6 = cmPolicies::PolicyMap::Get(local_340,CMP0052);
                if (PVar6 != OLD) {
                  if (PVar6 != WARN) goto LAB_002fe8cd;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_368,(cmPolicies *)0x34,id_00);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_320,local_368._M_dataplus._M_p,
                                       local_368._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_368._M_dataplus._M_p != &local_368.field_2) {
                    operator_delete(local_368._M_dataplus._M_p,
                                    local_368.field_2._M_allocated_capacity + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,"Directory:\n    \"",0x10);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_320,(input->_M_dataplus)._M_p,
                                       input->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"\"\nin INTERFACE_INCLUDE_DIRECTORIES of target \"",0x2e);
                  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"\" is a subdirectory of the install directory:\n    \"",0x33);
                  if (b == (char *)0x0) {
                    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                  }
                  else {
                    sVar11 = strlen(b);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,b,sVar11);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"\"\nhowever it is also a subdirectory of the ",0x2b);
                  pcVar12 = "source";
                  if (bVar2) {
                    pcVar12 = "build";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,pcVar12,6 - (ulong)bVar2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," tree:\n    \"",0xc);
                  pcVar12 = __s1;
                  if (bVar2) {
                    pcVar12 = __s2;
                  }
                  if (pcVar12 == (char *)0x0) {
                    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                  }
                  else {
                    sVar11 = strlen(pcVar12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar11);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
                  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
                  std::__cxx11::stringbuf::str();
                  cmLocalGenerator::IssueMessage(pcVar7,AUTHOR_WARNING,&local_368);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_368._M_dataplus._M_p != &local_368.field_2) {
                    operator_delete(local_368._M_dataplus._M_p,
                                    local_368.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
                  std::ios_base::~ios_base(local_2b0);
                }
              }
              else {
LAB_002fe8cd:
                if (bVar4 == false) goto LAB_002fe8d5;
              }
            }
            else {
LAB_002fe8d5:
              if (bVar2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Target \"",8);
                psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                                     psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(prop->_M_dataplus)._M_p,prop->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," property contains path:\n  \"",0x1c);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(input->_M_dataplus)._M_p,input->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\"\nwhich is prefixed in the build directory.",0x2b);
                pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
                std::__cxx11::stringbuf::str();
                cmLocalGenerator::IssueMessage(pcVar7,t,(string *)local_320);
                if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                  operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                }
              }
              if (bVar3 && local_344 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Target \"",8);
                psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,
                                     psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ",2);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(prop->_M_dataplus)._M_p,prop->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," property contains path:\n  \"",0x1c);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(input->_M_dataplus)._M_p,input->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\"\nwhich is prefixed in the source directory.",0x2c);
                pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
                std::__cxx11::stringbuf::str();
                cmLocalGenerator::IssueMessage(pcVar7,t,(string *)local_320);
                if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                  operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                }
              }
            }
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)prop);
          if ((iVar5 != 0) ||
             (PVar6 = cmPolicies::PolicyMap::Get(local_340,CMP0041), PVar6 - NEW < 3)) {
            bVar1 = 1;
            goto LAB_002fe610;
          }
          if (PVar6 != OLD) {
            if (PVar6 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_320,(cmPolicies *)0x29,id);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
              }
              t = WARNING;
            }
            goto LAB_002fe610;
          }
        }
LAB_002fecb1:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      input = input + 1;
    } while (input != local_338.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = (bool)(bVar1 ^ 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  return bVar2;
}

Assistant:

static bool checkInterfaceDirs(const std::string &prepro,
                      cmGeneratorTarget *target, const std::string& prop)
{
  const char* installDir =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  const char* topSourceDir =
      target->GetLocalGenerator()->GetSourceDirectory();
  const char* topBinaryDir =
      target->GetLocalGenerator()->GetBinaryDirectory();

  std::vector<std::string> parts;
  cmGeneratorExpression::Split(prepro, parts);

  const bool inSourceBuild = strcmp(topSourceDir, topBinaryDir) == 0;

  bool hadFatalError = false;

  for(std::vector<std::string>::iterator li = parts.begin();
      li != parts.end(); ++li)
    {
    size_t genexPos = cmGeneratorExpression::Find(*li);
    if (genexPos == 0)
      {
      continue;
      }
    cmake::MessageType messageType = cmake::FATAL_ERROR;
    std::ostringstream e;
    if (genexPos != std::string::npos)
      {
      if (prop == "INTERFACE_INCLUDE_DIRECTORIES")
        {
        switch (target->GetPolicyStatusCMP0041())
          {
          case cmPolicies::WARN:
            messageType = cmake::WARNING;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0041) << "\n";
            break;
          case cmPolicies::OLD:
            continue;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            hadFatalError = true;
            break; // Issue fatal message.
          }
        }
      else
        {
        hadFatalError = true;
        }
      }
    if (cmHasLiteralPrefix(li->c_str(), "${_IMPORT_PREFIX}"))
      {
      continue;
      }
    if (!cmSystemTools::FileIsFullPath(li->c_str()))
      {
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains relative path:\n"
           "  \"" << *li << "\"";
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    bool inBinary = isSubDirectory(li->c_str(), topBinaryDir);
    bool inSource = isSubDirectory(li->c_str(), topSourceDir);
    if (isSubDirectory(li->c_str(), installDir))
      {
      // The include directory is inside the install tree.  If the
      // install tree is not inside the source tree or build tree then
      // fall through to the checks below that the include directory is not
      // also inside the source tree or build tree.
      bool shouldContinue =
        (!inBinary || isSubDirectory(installDir, topBinaryDir)) &&
        (!inSource || isSubDirectory(installDir, topSourceDir));

      if (prop == "INTERFACE_INCLUDE_DIRECTORIES")
        {
        if (!shouldContinue)
          {
          switch(target->GetPolicyStatusCMP0052())
            {
            case cmPolicies::WARN:
              {
              std::ostringstream s;
              s << cmPolicies::GetPolicyWarning(cmPolicies::CMP0052) << "\n";
              s << "Directory:\n    \"" << *li << "\"\nin "
                "INTERFACE_INCLUDE_DIRECTORIES of target \""
                << target->GetName() << "\" is a subdirectory of the install "
                "directory:\n    \"" << installDir << "\"\nhowever it is also "
                "a subdirectory of the " << (inBinary ? "build" : "source")
                << " tree:\n    \"" << (inBinary ? topBinaryDir : topSourceDir)
                << "\"" << std::endl;
              target->GetLocalGenerator()->IssueMessage(cmake::AUTHOR_WARNING,
                                                  s.str());
              }
            case cmPolicies::OLD:
              shouldContinue = true;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        }
      if (shouldContinue)
        {
        continue;
        }
      }
    if (inBinary)
      {
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains path:\n"
           "  \"" << *li << "\"\nwhich is prefixed in the build directory.";
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    if (!inSourceBuild)
      {
      if (inSource)
        {
        e << "Target \"" << target->GetName() << "\" " << prop <<
            " property contains path:\n"
            "  \"" << *li << "\"\nwhich is prefixed in the source directory.";
        target->GetLocalGenerator()->IssueMessage(messageType, e.str());
        }
      }
    }
  return !hadFatalError;
}